

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O0

BUFFER_HANDLE constructPublishReply(CONTROL_PACKET_TYPE type,uint8_t flags,uint16_t packetId)

{
  int iVar1;
  byte *local_20;
  uint8_t *iterator;
  BUFFER_HANDLE result;
  uint16_t packetId_local;
  uint8_t flags_local;
  CONTROL_PACKET_TYPE type_local;
  
  result._0_2_ = packetId;
  result._3_1_ = flags;
  result._4_4_ = type;
  iterator = (uint8_t *)BUFFER_new();
  if ((BUFFER_HANDLE)iterator != (BUFFER_HANDLE)0x0) {
    iVar1 = BUFFER_pre_build((BUFFER_HANDLE)iterator,4);
    if (iVar1 == 0) {
      local_20 = BUFFER_u_char((BUFFER_HANDLE)iterator);
      if (local_20 == (byte *)0x0) {
        BUFFER_delete((BUFFER_HANDLE)iterator);
        iterator = (uint8_t *)0x0;
      }
      else {
        *local_20 = (byte)result._4_4_ | result._3_1_;
        local_20[1] = 2;
        local_20 = local_20 + 2;
        byteutil_writeInt(&local_20,(uint16_t)result);
      }
    }
    else {
      BUFFER_delete((BUFFER_HANDLE)iterator);
      iterator = (uint8_t *)0x0;
    }
  }
  return (BUFFER_HANDLE)iterator;
}

Assistant:

static BUFFER_HANDLE constructPublishReply(CONTROL_PACKET_TYPE type, uint8_t flags, uint16_t packetId)
{
    BUFFER_HANDLE result = BUFFER_new();
    if (result != NULL)
    {
        if (BUFFER_pre_build(result, 4) != 0)
        {
            BUFFER_delete(result);
            result = NULL;
        }
        else
        {
            uint8_t* iterator = BUFFER_u_char(result);
            if (iterator == NULL)
            {
                BUFFER_delete(result);
                result = NULL;
            }
            else
            {
                *iterator = (uint8_t)type | flags;
                iterator++;
                *iterator = 0x2;
                iterator++;
                byteutil_writeInt(&iterator, packetId);
            }
        }
    }
    return result;
}